

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O2

Vec_Wrd_t * Vec_WrdStartRandom(int nSize)

{
  Vec_Wrd_t *pVVar1;
  word wVar2;
  ulong uVar3;
  ulong uVar4;
  
  pVVar1 = Vec_WrdStart(nSize);
  uVar4 = 0;
  uVar3 = (ulong)(uint)nSize;
  if (nSize < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    wVar2 = Abc_RandomW(0);
    pVVar1->pArray[uVar4] = wVar2;
  }
  return pVVar1;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdStartRandom( int nSize )
{
    Vec_Wrd_t * vSims = Vec_WrdStart( nSize ); int i;
    for ( i = 0; i < nSize; i++ )
        vSims->pArray[i] = Abc_RandomW(0);
    return vSims;
}